

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_thread.cpp
# Opt level: O0

void __thiscall tst_thread::resolve_void(tst_thread *this)

{
  QThread *t1;
  bool bVar1;
  ulong uVar2;
  QThread *t2;
  anon_class_8_1_6bb45959 local_60;
  anon_class_16_2_77a2518b local_58;
  QPromiseBase<void> local_48;
  QPromiseBase<void> local_38;
  QThread *local_28;
  QThread *source;
  QThread *target;
  tst_thread *ptStack_10;
  int value;
  tst_thread *this_local;
  
  target._4_4_ = -1;
  source = (QThread *)0x0;
  local_28 = (QThread *)0x0;
  local_60.source = &local_28;
  ptStack_10 = this;
  QtPromise::QPromise<void>::QPromise<tst_thread::resolve_void()::__0>
            ((QPromise<void> *)&local_58,&local_60);
  QtPromise::QPromiseBase<void>::then<tst_thread::resolve_void()::__1>(&local_48,&local_58);
  QtPromise::QPromiseBase<void>::wait(&local_38,&local_48);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_38);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_48);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_58);
  uVar2 = QTest::qVerify(local_28 != (QThread *)0x0,"source != nullptr","",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                         ,0x48);
  if (((uVar2 & 1) != 0) &&
     (uVar2 = QTest::qVerify(local_28 != source,"source != target","",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                             ,0x49), t1 = source, (uVar2 & 1) != 0)) {
    t2 = (QThread *)QThread::currentThread();
    bVar1 = QTest::qCompare<QThread>
                      (t1,t2,"target","QThread::currentThread()",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                       ,0x4a);
    if (bVar1) {
      QTest::qCompare(target._4_4_,0x2b,"value","43",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                      ,0x4b);
    }
  }
  return;
}

Assistant:

void tst_thread::resolve_void()
{
    int value = -1;
    QThread* target = nullptr;
    QThread* source = nullptr;

    QtPromise::QPromise<void>{[&](const QtPromise::QPromiseResolve<void>& resolve) {
        std::ignore = QtConcurrent::run([=, &source]() {
            source = QThread::currentThread();
            resolve();
        });
    }}
        .then([&]() {
            target = QThread::currentThread();
            value = 43;
        })
        .wait();

    QVERIFY(source != nullptr);
    QVERIFY(source != target);
    QCOMPARE(target, QThread::currentThread());
    QCOMPARE(value, 43);
}